

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

uint32 __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::ExtractSlotInfo_TTD
          (DictionaryTypeHandlerBase<unsigned_short> *this,SnapHandlerPropertyEntry *entryInfo,
          ThreadContext *threadContext,SlabAllocator *alloc)

{
  PropertyId pid;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  bool bVar2;
  ushort uVar3;
  unsigned_short uVar4;
  uint32 uVar5;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar6;
  EntryType *pEVar7;
  SnapEntryDataKindTag dataKind;
  uint32 uVar8;
  ushort uVar9;
  undefined1 local_60 [8];
  EntryIterator<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  iter;
  DictionaryPropertyDescriptor<unsigned_short> local_38;
  DictionaryPropertyDescriptor<unsigned_short> descriptor;
  
  JsUtil::
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   *)local_60,(this->propertyMap).ptr);
  bVar2 = JsUtil::
          BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::
          EntryIterator<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
          ::IsValid((EntryIterator<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                     *)local_60);
  uVar8 = 1;
  if (bVar2) {
    uVar9 = 0;
    iter.
    super_IteratorBase<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
    ._24_8_ = this;
    do {
      pDVar6 = (DictionaryPropertyDescriptor<unsigned_short> *)
               JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::
               IteratorBase<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
               ::Current((IteratorBase<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                          *)local_60);
      local_38 = *pDVar6;
      pEVar7 = JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::
               IteratorBase<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
               ::Current((IteratorBase<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                          *)local_60);
      pid = ((pEVar7->
             super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             ).
             super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>_>
             .
             super_ValueEntry<Js::DictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>_>_>
             .
             super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>_>
             .key.ptr)->pid;
      uVar3 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(&local_38);
      if (uVar3 == 0xffff) {
        if (((ulong)local_38 & 8) == 0) {
          TTDAbort_unrecoverable_error("How can this not be initialized?");
        }
        uVar4 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex(&local_38);
        if (uVar4 != 0xffff) {
          if (uVar9 <= uVar4) {
            uVar9 = uVar4;
          }
          TTD::NSSnapType::ExtractSnapPropertyEntryInfo
                    (entryInfo + uVar4,pid,local_38.Attributes,Getter);
        }
        uVar3 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(&local_38);
        if (uVar3 != 0xffff) {
          if (uVar9 <= uVar3) {
            uVar9 = uVar3;
          }
          dataKind = Setter;
          goto LAB_00d99729;
        }
      }
      else {
        uVar4 = uVar3;
        if (uVar3 < uVar9) {
          uVar4 = uVar9;
        }
        uVar9 = uVar4;
        dataKind = Data - (((ulong)local_38 & 8) == 0);
LAB_00d99729:
        TTD::NSSnapType::ExtractSnapPropertyEntryInfo
                  (entryInfo + uVar3,pid,local_38.Attributes,dataKind);
      }
      JsUtil::
      BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::
      EntryIterator<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
      ::MoveNext((EntryIterator<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                  *)local_60);
      bVar2 = JsUtil::
              BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::
              EntryIterator<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
              ::IsValid((EntryIterator<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                         *)local_60);
    } while (bVar2);
    uVar8 = uVar9 + 1;
    this = (DictionaryTypeHandlerBase<unsigned_short> *)
           iter.
           super_IteratorBase<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
           ._24_8_;
  }
  pBVar1 = (this->propertyMap).ptr;
  uVar5 = 0;
  if (pBVar1->count != pBVar1->freeCount) {
    uVar5 = uVar8;
  }
  return uVar5;
}

Assistant:

uint32 DictionaryTypeHandlerBase<T>::ExtractSlotInfo_TTD(TTD::NSSnapType::SnapHandlerPropertyEntry* entryInfo, ThreadContext* threadContext, TTD::SlabAllocator& alloc) const
    {
        T maxSlot = 0;

        for (auto iter = this->propertyMap->GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            DictionaryPropertyDescriptor<T> descriptor = iter.CurrentValue();
            Js::PropertyId pid = iter.CurrentKey()->GetPropertyId();

            T dIndex = descriptor.template GetDataPropertyIndex<false>();
            if (dIndex != NoSlots)
            {
                maxSlot = max(maxSlot, dIndex);

#if ENABLE_FIXED_FIELDS
                TTD::NSSnapType::SnapEntryDataKindTag tag = descriptor.GetIsInitialized() ? TTD::NSSnapType::SnapEntryDataKindTag::Data : TTD::NSSnapType::SnapEntryDataKindTag::Uninitialized;
#else
                TTD::NSSnapType::SnapEntryDataKindTag tag = TTD::NSSnapType::SnapEntryDataKindTag::Data;
#endif
                TTD::NSSnapType::ExtractSnapPropertyEntryInfo(entryInfo + dIndex, pid, descriptor.Attributes, tag);
            }
            else
            {
#if ENABLE_FIXED_FIELDS
                TTDAssert(descriptor.GetIsInitialized(), "How can this not be initialized?");
#endif

                T gIndex = descriptor.GetGetterPropertyIndex();
                if (gIndex != NoSlots)
                {
                    maxSlot = max(maxSlot, gIndex);

                    TTD::NSSnapType::SnapEntryDataKindTag tag = TTD::NSSnapType::SnapEntryDataKindTag::Getter;
                    TTD::NSSnapType::ExtractSnapPropertyEntryInfo(entryInfo + gIndex, pid, descriptor.Attributes, tag);
                }

                T sIndex = descriptor.GetSetterPropertyIndex();
                if (sIndex != NoSlots)
                {
                    maxSlot = max(maxSlot, sIndex);

                    TTD::NSSnapType::SnapEntryDataKindTag tag = TTD::NSSnapType::SnapEntryDataKindTag::Setter;
                    TTD::NSSnapType::ExtractSnapPropertyEntryInfo(entryInfo + sIndex, pid, descriptor.Attributes, tag);
                }
            }
        }

        if (this->propertyMap->Count() == 0)
        {
            return 0;
        }
        else
        {
            return (uint32)(maxSlot + 1);
        }
    }